

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_3,_3> *
tcu::operator*(Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_4> *a,
              Matrix<float,_4,_3> *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int row_1;
  long lVar3;
  Matrix<float,_3,_3> *res;
  float *pfVar4;
  int row;
  long lVar5;
  Vector<float,_4> *pVVar6;
  long lVar7;
  Vector<float,_3> *pVVar8;
  int ndx;
  float v;
  float fVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  long lVar11;
  
  pVVar8 = (__return_storage_ptr__->m_data).m_data;
  pVVar8[1].m_data[1] = 0.0;
  pVVar8[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar2 = _DAT_019fcc00;
  auVar1 = _DAT_019f5ce0;
  lVar3 = 0;
  lVar5 = 0;
  pfVar4 = (float *)__return_storage_ptr__;
  do {
    lVar7 = 0;
    auVar10 = auVar2;
    do {
      bVar12 = SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffd
      ;
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar7) = uVar13;
      }
      if (bVar12) {
        uVar13 = 0x3f800000;
        if (lVar3 + -0xc != lVar7) {
          uVar13 = 0;
        }
        *(undefined4 *)((long)pfVar4 + lVar7 + 0xc) = uVar13;
      }
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x30);
    lVar5 = lVar5 + 1;
    lVar3 = lVar3 + 0xc;
    pfVar4 = pfVar4 + 1;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    lVar5 = 0;
    pVVar6 = (Vector<float,_4> *)b;
    do {
      fVar9 = 0.0;
      lVar7 = 0;
      pVVar8 = (Vector<float,_3> *)a;
      do {
        fVar9 = fVar9 + ((Vector<tcu::Vector<float,_3>,_4> *)pVVar8->m_data)->m_data[0].m_data[0] *
                        ((Vector<tcu::Vector<float,_4>,_3> *)pVVar6->m_data)->m_data[0].m_data
                        [lVar7];
        lVar7 = lVar7 + 1;
        pVVar8 = pVVar8 + 1;
      } while (lVar7 != 4);
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar3] = fVar9;
      lVar5 = lVar5 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    a = (Matrix<float,_3,_4> *)(((Vector<float,_3> *)a)->m_data + 1);
  } while (lVar3 != 3);
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}